

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_perm_c.c
# Opt level: O0

void getata(int m,int n,int_t nz,int_t *colptr,int_t *rowind,int_t *atanz,int_t **ata_colptr,
           int_t **ata_rowind)

{
  int iVar1;
  int iVar2;
  int_t *piVar3;
  void *addr;
  undefined4 *addr_00;
  void *addr_01;
  int_t *piVar4;
  int local_57c;
  char local_578 [8];
  char msg_4 [256];
  char msg_3 [256];
  char msg_2 [256];
  char msg_1 [256];
  char msg [256];
  int_t *t_rowind;
  int_t *t_colptr;
  int_t *b_rowind;
  int_t *b_colptr;
  int_t *marker;
  int local_48;
  int_t trow;
  int_t ti;
  int_t num_nz;
  int_t col;
  int_t k;
  int_t j;
  int_t i;
  int_t *atanz_local;
  int_t *rowind_local;
  int_t *colptr_local;
  int_t nz_local;
  int n_local;
  int m_local;
  
  local_57c = n;
  if (n < m) {
    local_57c = m;
  }
  addr = superlu_malloc((long)(local_57c + 1) << 2);
  if (addr == (void *)0x0) {
    sprintf(msg_1 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker[]",0xa2,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg_1 + 0xf8);
  }
  addr_00 = (undefined4 *)superlu_malloc((long)(m + 1) << 2);
  if (addr_00 == (undefined4 *)0x0) {
    sprintf(msg_2 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC t_colptr[]",0xa4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg_2 + 0xf8);
  }
  addr_01 = superlu_malloc((long)nz << 2);
  if (addr_01 == (void *)0x0) {
    sprintf(msg_3 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for t_rowind[]",0xa6,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg_3 + 0xf8);
  }
  for (k = 0; k < m; k = k + 1) {
    *(undefined4 *)((long)addr + (long)k * 4) = 0;
  }
  for (col = 0; col < n; col = col + 1) {
    for (k = colptr[col]; k < colptr[col + 1]; k = k + 1) {
      *(int *)((long)addr + (long)rowind[k] * 4) = *(int *)((long)addr + (long)rowind[k] * 4) + 1;
    }
  }
  *addr_00 = 0;
  for (k = 0; k < m; k = k + 1) {
    addr_00[k + 1] = addr_00[k] + *(int *)((long)addr + (long)k * 4);
    *(undefined4 *)((long)addr + (long)k * 4) = addr_00[k];
  }
  for (col = 0; col < n; col = col + 1) {
    for (k = colptr[col]; k < colptr[col + 1]; k = k + 1) {
      iVar1 = rowind[k];
      *(int_t *)((long)addr_01 + (long)*(int *)((long)addr + (long)iVar1 * 4) * 4) = col;
      *(int *)((long)addr + (long)iVar1 * 4) = *(int *)((long)addr + (long)iVar1 * 4) + 1;
    }
  }
  for (k = 0; k < n; k = k + 1) {
    *(undefined4 *)((long)addr + (long)k * 4) = 0xffffffff;
  }
  trow = 0;
  for (col = 0; col < n; col = col + 1) {
    *(int_t *)((long)addr + (long)col * 4) = col;
    for (k = colptr[col]; k < colptr[col + 1]; k = k + 1) {
      iVar1 = rowind[k];
      for (local_48 = addr_00[iVar1]; local_48 < (int)addr_00[iVar1 + 1]; local_48 = local_48 + 1) {
        iVar2 = *(int *)((long)addr_01 + (long)local_48 * 4);
        if (*(int *)((long)addr + (long)iVar2 * 4) != col) {
          *(int_t *)((long)addr + (long)iVar2 * 4) = col;
          trow = trow + 1;
        }
      }
    }
  }
  *atanz = trow;
  piVar4 = (int_t *)superlu_malloc((long)(n + 1) << 2);
  *ata_colptr = piVar4;
  if (piVar4 == (int_t *)0x0) {
    sprintf(msg_4 + 0xf8,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ata_colptr[]",0xe4,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit(msg_4 + 0xf8);
  }
  if (*atanz != 0) {
    piVar4 = (int_t *)superlu_malloc((long)*atanz << 2);
    *ata_rowind = piVar4;
    if (piVar4 == (int_t *)0x0) {
      sprintf(local_578,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for ata_rowind[]",0xe7,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit(local_578);
    }
  }
  piVar4 = *ata_colptr;
  piVar3 = *ata_rowind;
  for (k = 0; k < n; k = k + 1) {
    *(undefined4 *)((long)addr + (long)k * 4) = 0xffffffff;
  }
  trow = 0;
  for (col = 0; col < n; col = col + 1) {
    piVar4[col] = trow;
    *(int_t *)((long)addr + (long)col * 4) = col;
    for (k = colptr[col]; k < colptr[col + 1]; k = k + 1) {
      iVar1 = rowind[k];
      for (local_48 = addr_00[iVar1]; local_48 < (int)addr_00[iVar1 + 1]; local_48 = local_48 + 1) {
        iVar2 = *(int *)((long)addr_01 + (long)local_48 * 4);
        if (*(int *)((long)addr + (long)iVar2 * 4) != col) {
          *(int_t *)((long)addr + (long)iVar2 * 4) = col;
          piVar3[trow] = iVar2;
          trow = trow + 1;
        }
      }
    }
  }
  piVar4[n] = trow;
  superlu_free(addr);
  superlu_free(addr_00);
  superlu_free(addr_01);
  return;
}

Assistant:

void getata(const int m, const int n, const int_t nz, const int_t *colptr, const int_t *rowind,
            int_t *atanz, int_t **ata_colptr, int_t **ata_rowind)
{
    register int_t i, j, k, col, num_nz, ti, trow;
    int_t *marker, *b_colptr, *b_rowind;
    int_t *t_colptr, *t_rowind; /* a column oriented form of T = A' */

    if ( !(marker = (int_t*) SUPERLU_MALLOC((SUPERLU_MAX(m,n)+1)*sizeof(int_t))) )
	ABORT("SUPERLU_MALLOC fails for marker[]");
    if ( !(t_colptr = (int_t*) SUPERLU_MALLOC((m+1) * sizeof(int_t))) )
	ABORT("SUPERLU_MALLOC t_colptr[]");
    if ( !(t_rowind = (int_t*) SUPERLU_MALLOC(nz * sizeof(int_t))) )
	ABORT("SUPERLU_MALLOC fails for t_rowind[]");

    
    /* Get counts of each column of T, and set up column pointers */
    for (i = 0; i < m; ++i) marker[i] = 0;
    for (j = 0; j < n; ++j) {
	for (i = colptr[j]; i < colptr[j+1]; ++i)
	    ++marker[rowind[i]];
    }
    t_colptr[0] = 0;
    for (i = 0; i < m; ++i) {
	t_colptr[i+1] = t_colptr[i] + marker[i];
	marker[i] = t_colptr[i];
    }

    /* Transpose the matrix from A to T */
    for (j = 0; j < n; ++j)
	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    col = rowind[i];
	    t_rowind[marker[col]] = j;
	    ++marker[col];
	}

    
    /* ----------------------------------------------------------------
       compute B = T * A, where column j of B is:

       Struct (B_*j) =    UNION   ( Struct (T_*k) )
                        A_kj != 0

       do not include the diagonal entry
   
       ( Partition A as: A = (A_*1, ..., A_*n)
         Then B = T * A = (T * A_*1, ..., T * A_*n), where
         T * A_*j = (T_*1, ..., T_*m) * A_*j.  )
       ---------------------------------------------------------------- */

    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;

    /* First pass determines number of nonzeros in B */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    /* A_kj is nonzero, add pattern of column T_*k to B_*j */
	    k = rowind[i];
	    for (ti = t_colptr[k]; ti < t_colptr[k+1]; ++ti) {
		trow = t_rowind[ti];
		if ( marker[trow] != j ) {
		    marker[trow] = j;
		    num_nz++;
		}
	    }
	}
    }
    *atanz = num_nz;
    
    /* Allocate storage for A'*A */
    if ( !(*ata_colptr = (int_t*) SUPERLU_MALLOC( (n+1) * sizeof(int_t)) ) )
	ABORT("SUPERLU_MALLOC fails for ata_colptr[]");
    if ( *atanz ) {
	if ( !(*ata_rowind = (int_t*) SUPERLU_MALLOC( *atanz * sizeof(int_t)) ) )
	    ABORT("SUPERLU_MALLOC fails for ata_rowind[]");
    }
    b_colptr = *ata_colptr; /* aliasing */
    b_rowind = *ata_rowind;
    
    /* Zero the diagonal flag */
    for (i = 0; i < n; ++i) marker[i] = -1;
    
    /* Compute each column of B, one at a time */
    num_nz = 0;
    for (j = 0; j < n; ++j) {
	b_colptr[j] = num_nz;
	
	/* Flag the diagonal so it's not included in the B matrix */
	marker[j] = j;

	for (i = colptr[j]; i < colptr[j+1]; ++i) {
	    /* A_kj is nonzero, add pattern of column T_*k to B_*j */
	    k = rowind[i];
	    for (ti = t_colptr[k]; ti < t_colptr[k+1]; ++ti) {
		trow = t_rowind[ti];
		if ( marker[trow] != j ) {
		    marker[trow] = j;
		    b_rowind[num_nz++] = trow;
		}
	    }
	}
    }
    b_colptr[n] = num_nz;
       
    SUPERLU_FREE(marker);
    SUPERLU_FREE(t_colptr);
    SUPERLU_FREE(t_rowind);
}